

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

uint anon_unknown.dwarf_114571a::GetParallelCPUCount(void)

{
  uint *puVar1;
  uint local_24;
  uint local_20 [4];
  SystemInformation local_10;
  SystemInformation info;
  
  if (GetParallelCPUCount::count == 0) {
    cmsys::SystemInformation::SystemInformation(&local_10);
    cmsys::SystemInformation::RunCPUCheck(&local_10);
    local_20[0] = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_10);
    local_24 = 1;
    puVar1 = std::clamp<unsigned_int>(local_20,&local_24,&cmQtAutoGen::ParallelMax);
    GetParallelCPUCount::count = *puVar1;
    cmsys::SystemInformation::~SystemInformation(&local_10);
  }
  return GetParallelCPUCount::count;
}

Assistant:

unsigned int GetParallelCPUCount()
{
  static unsigned int count = 0;
  // Detect only on the first call
  if (count == 0) {
    cmsys::SystemInformation info;
    info.RunCPUCheck();
    count =
      cm::clamp(info.GetNumberOfPhysicalCPU(), 1u, cmQtAutoGen::ParallelMax);
  }
  return count;
}